

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional_scalars_test_json_parser.h
# Opt level: O2

char * optional_scalars_test_global_json_parser_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_type,uint64_t *value,
                 int *aggregate)

{
  uint64_t uVar1;
  char *pcVar2;
  char *mark;
  
  uVar1 = flatcc_json_parser_symbol_part(buf,end);
  if (uVar1 == 0x6f7074696f6e616c) {
    uVar1 = flatcc_json_parser_symbol_part(buf + 8,end);
    if (uVar1 == 0x5f7363616c617273) {
      uVar1 = flatcc_json_parser_symbol_part(buf + 0x10,end);
      if (uVar1 == 0x2e4f7074696f6e61) {
        pcVar2 = buf + 0x18;
        uVar1 = flatcc_json_parser_symbol_part(pcVar2,end);
        if (uVar1 >> 8 == 0x6c466163746f72) {
          if ((7 < (long)end - (long)pcVar2) && (buf[0x1f] == '.')) {
            pcVar2 = optional_scalars_OptionalFactor_parse_json_enum
                               (ctx,buf + 0x20,end,value_type,value,aggregate);
            return pcVar2;
          }
        }
        else if ((5 < (long)end - (long)pcVar2 && uVar1 >> 0x18 == 0x6c42797465) &&
                (buf[0x1d] == '.')) {
          pcVar2 = optional_scalars_OptionalByte_parse_json_enum
                             (ctx,buf + 0x1e,end,value_type,value,aggregate);
          return pcVar2;
        }
      }
    }
  }
  return buf;
}

Assistant:

static const char *optional_scalars_test_global_json_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_type, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w == 0x6f7074696f6e616c) { /* descend "optional" */
        buf += 8;
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w == 0x5f7363616c617273) { /* descend "_scalars" */
            buf += 8;
            w = flatcc_json_parser_symbol_part(buf, end);
            if (w == 0x2e4f7074696f6e61) { /* descend ".Optiona" */
                buf += 8;
                w = flatcc_json_parser_symbol_part(buf, end);
                if ((w & 0xffffffffffffff00) == 0x6c466163746f7200) { /* "lFactor" */
                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 7);
                    if (buf != mark) {
                        buf = optional_scalars_OptionalFactor_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                    } else {
                        return unmatched;
                    }
                } else { /* "lFactor" */
                    if ((w & 0xffffffffff000000) == 0x6c42797465000000) { /* "lByte" */
                        buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 5);
                        if (buf != mark) {
                            buf = optional_scalars_OptionalByte_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                        } else {
                            return unmatched;
                        }
                    } else { /* "lByte" */
                        return unmatched;
                    } /* "lByte" */
                } /* "lFactor" */
            } else { /* descend ".Optiona" */
                return unmatched;
            } /* descend ".Optiona" */
        } else { /* descend "_scalars" */
            return unmatched;
        } /* descend "_scalars" */
    } else { /* descend "optional" */
        return unmatched;
    } /* descend "optional" */
    return buf;
}